

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Cte * sqlite3CteNew(Parse *pParse,Token *pName,ExprList *pArglist,Select *pQuery,u8 eM10d)

{
  sqlite3 *db;
  Cte *pCVar1;
  char *pcVar2;
  
  db = pParse->db;
  pCVar1 = (Cte *)sqlite3DbMallocZero(db,0x30);
  if (db->mallocFailed == '\0') {
    pCVar1->pSelect = pQuery;
    pCVar1->pCols = pArglist;
    pcVar2 = sqlite3NameFromToken(pParse->db,pName);
    pCVar1->zName = pcVar2;
    pCVar1->eM10d = eM10d;
  }
  else {
    if (pArglist != (ExprList *)0x0) {
      exprListDeleteNN(db,pArglist);
    }
    if (pQuery != (Select *)0x0) {
      clearSelect(db,pQuery,1);
    }
  }
  return pCVar1;
}

Assistant:

SQLITE_PRIVATE Cte *sqlite3CteNew(
  Parse *pParse,          /* Parsing context */
  Token *pName,           /* Name of the common-table */
  ExprList *pArglist,     /* Optional column name list for the table */
  Select *pQuery,         /* Query used to initialize the table */
  u8 eM10d                /* The MATERIALIZED flag */
){
  Cte *pNew;
  sqlite3 *db = pParse->db;

  pNew = sqlite3DbMallocZero(db, sizeof(*pNew));
  assert( pNew!=0 || db->mallocFailed );

  if( db->mallocFailed ){
    sqlite3ExprListDelete(db, pArglist);
    sqlite3SelectDelete(db, pQuery);
  }else{
    pNew->pSelect = pQuery;
    pNew->pCols = pArglist;
    pNew->zName = sqlite3NameFromToken(pParse->db, pName);
    pNew->eM10d = eM10d;
  }
  return pNew;
}